

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O0

errr parse_specs(parser_hook *h,char *fmt)

{
  wchar_t wVar1;
  char *pcVar2;
  parser_spec *ppVar3;
  parser_spec *s;
  wchar_t type;
  char *stype;
  char *name;
  char *fmt_local;
  parser_hook *h_local;
  
  if (h == (parser_hook *)0x0) {
    __assert_fail("h",
                  "/workspace/llm4binary/github/license_c_cmakelists/angband[P]angband/src/parser.c"
                  ,0x1a3,"errr parse_specs(struct parser_hook *, char *)");
  }
  if (fmt == (char *)0x0) {
    __assert_fail("fmt",
                  "/workspace/llm4binary/github/license_c_cmakelists/angband[P]angband/src/parser.c"
                  ,0x1a4,"errr parse_specs(struct parser_hook *, char *)");
  }
  stype = strtok(fmt," ");
  if (stype == (char *)0x0) {
    h_local._4_4_ = -0x16;
  }
  else {
    pcVar2 = string_make(stype);
    h->dir = pcVar2;
    h->fhead = (parser_spec *)0x0;
    h->ftail = (parser_spec *)0x0;
    while ((stype != (char *)0x0 && (pcVar2 = strtok((char *)0x0," "), pcVar2 != (char *)0x0))) {
      stype = strtok((char *)0x0," ");
      if (stype == (char *)0x0) {
        clean_specs(h);
        return -0x16;
      }
      wVar1 = parse_type(pcVar2);
      if (wVar1 == L'\0') {
        clean_specs(h);
        return -0x16;
      }
      if ((((wVar1 & 1U) == 0) && (h->ftail != (parser_spec *)0x0)) && ((h->ftail->type & 1U) != 0))
      {
        clean_specs(h);
        return -0x16;
      }
      if ((h->ftail != (parser_spec *)0x0) && ((h->ftail->type & 0xfffffffeU) == 6)) {
        clean_specs(h);
        return -0x16;
      }
      ppVar3 = (parser_spec *)mem_alloc(0x18);
      ppVar3->type = wVar1;
      pcVar2 = string_make(stype);
      ppVar3->name = pcVar2;
      ppVar3->next = (parser_spec *)0x0;
      if (h->fhead == (parser_spec *)0x0) {
        h->fhead = ppVar3;
      }
      else {
        h->ftail->next = ppVar3;
      }
      h->ftail = ppVar3;
    }
    h_local._4_4_ = 0;
  }
  return h_local._4_4_;
}

Assistant:

static errr parse_specs(struct parser_hook *h, char *fmt) {
	char *name ;
	char *stype = NULL;
	int type;
	struct parser_spec *s;

	assert(h);
	assert(fmt);

	name = strtok(fmt, " ");
	if (!name)
		return -EINVAL;
	h->dir = string_make(name);
	h->fhead = NULL;
	h->ftail = NULL;
	while (name) {
		/* Lack of a type is legal; that means we're at the end of the line. */
		stype = strtok(NULL, " ");
		if (!stype)
			break;

		/* Lack of a name, on the other hand... */
		name = strtok(NULL, " ");
		if (!name) {
			clean_specs(h);
			return -EINVAL;
		}

		/* Grab a type, check to see if we have a mandatory type
		 * following an optional type. */
		type = parse_type(stype);
		if (type == PARSE_T_NONE) {
			clean_specs(h);
			return -EINVAL;
		}
		if (!(type & PARSE_T_OPT) && h->ftail &&
			(h->ftail->type & PARSE_T_OPT)) {
			clean_specs(h);
			return -EINVAL;
		}
		if (h->ftail && ((h->ftail->type & ~PARSE_T_OPT) == PARSE_T_STR)) {
			clean_specs(h);
			return -EINVAL;
		}

		/* Save this spec. */
		s = mem_alloc(sizeof *s);
		s->type = type;
		s->name = string_make(name);
		s->next = NULL;
		if (h->fhead)
			h->ftail->next = s;
		else
			h->fhead = s;
		h->ftail = s;
	}

	return 0;
}